

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O2

void __thiscall
ktx::CommandExtract::saveRawFile
          (CommandExtract *this,string *filepath,bool appendExtension,char *data,size_t size)

{
  bool bVar1;
  undefined7 in_register_00000011;
  Reporter *report;
  OutputStream file;
  OutputStream local_50;
  
  if ((int)CONCAT71(in_register_00000011,appendExtension) != 0) {
    bVar1 = std::operator!=(filepath,"-");
    if (bVar1) {
      std::__cxx11::string::append((char *)filepath);
    }
  }
  report = &(this->super_Command).super_Reporter;
  OutputStream::OutputStream(&local_50,filepath,report);
  OutputStream::write(&local_50,(int)data,(void *)size,(size_t)report);
  OutputStream::~OutputStream(&local_50);
  return;
}

Assistant:

void CommandExtract::saveRawFile(std::string filepath, bool appendExtension, const char* data, std::size_t size) {
    if (appendExtension && filepath != "-")
        filepath += ".raw";
    OutputStream file(filepath, *this);
    file.write(data, size, *this);
}